

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MachineForTarget.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
* __thiscall
Machine::TargetsByMachineName_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
           *__return_storage_ptr__,Machine *this,bool meaningful_without_media_only)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Target *pTVar3;
  size_type __dnew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Enterprise::Target_*>
  local_60;
  size_type local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_local_buf[0] = 'A';
  local_70._M_allocated_capacity._1_2_ = 0x696d;
  local_70._M_local_buf[3] = 'g';
  local_70._M_local_buf[4] = 'a';
  local_70._M_local_buf[5] = '\0';
  local_78 = 5;
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0x90);
  Analyser::Static::Amiga::Target::Target((Target *)pTVar3);
  paVar2 = &local_60.first.field_2;
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Amiga::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Amiga::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'A';
  local_70._M_allocated_capacity._1_2_ = 0x736d;
  local_70._M_local_buf[3] = 't';
  local_70._M_local_buf[4] = 'r';
  local_70._M_local_buf[5] = 'a';
  local_70._M_local_buf[6] = 'd';
  local_70._M_local_buf[7] = ' ';
  local_70._M_local_buf[8] = 'C';
  local_70._M_local_buf[9] = 'P';
  local_70._M_local_buf[10] = 'C';
  local_78 = 0xb;
  local_70._M_local_buf[0xb] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0xb0);
  Analyser::Static::AmstradCPC::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::AmstradCPC::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AmstradCPC::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'A';
  local_70._M_allocated_capacity._1_2_ = 0x7070;
  local_70._M_local_buf[3] = 'l';
  local_70._M_local_buf[4] = 'e';
  local_70._M_local_buf[5] = ' ';
  local_70._M_local_buf[6] = 'I';
  local_70._M_local_buf[7] = 'I';
  local_78 = 8;
  local_70._M_local_buf[8] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0x98);
  Analyser::Static::AppleII::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::AppleII::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AppleII::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'A';
  local_70._M_allocated_capacity._1_2_ = 0x7070;
  local_70._M_local_buf[3] = 'l';
  local_70._M_local_buf[4] = 'e';
  local_70._M_local_buf[5] = ' ';
  local_70._M_local_buf[6] = 'I';
  local_70._M_local_buf[7] = 'I';
  local_70._M_local_buf[8] = 'g';
  local_70._M_local_buf[9] = 's';
  local_78 = 10;
  local_70._M_local_buf[10] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0x90);
  Analyser::Static::AppleIIgs::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::AppleIIgs::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AppleIIgs::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'A';
  local_70._M_allocated_capacity._1_2_ = 0x6174;
  local_70._M_local_buf[3] = 'r';
  local_70._M_local_buf[4] = 'i';
  local_70._M_local_buf[5] = ' ';
  local_70._M_local_buf[6] = 'S';
  local_70._M_local_buf[7] = 'T';
  local_78 = 8;
  local_70._M_local_buf[8] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0x90);
  Analyser::Static::AtariST::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::AtariST::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AtariST::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'A';
  local_70._M_allocated_capacity._1_2_ = 0x6f63;
  local_70._M_local_buf[3] = 'r';
  local_70._M_local_buf[4] = 'n';
  local_70._M_local_buf[5] = ' ';
  local_70._M_local_buf[6] = 'E';
  local_70._M_local_buf[7] = 'l';
  local_70._M_local_buf[8] = 'e';
  local_70._M_local_buf[9] = 'c';
  local_70._M_local_buf[10] = 't';
  local_70._M_local_buf[0xb] = 'r';
  local_70._M_local_buf[0xc] = 'o';
  local_70._M_local_buf[0xd] = 'n';
  local_78 = 0xe;
  local_70._M_local_buf[0xe] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0xb0);
  Analyser::Static::Acorn::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Acorn::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Acorn::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'E';
  local_70._M_allocated_capacity._1_2_ = 0x746e;
  local_70._M_local_buf[3] = 'e';
  local_70._M_local_buf[4] = 'r';
  local_70._M_local_buf[5] = 'p';
  local_70._M_local_buf[6] = 'r';
  local_70._M_local_buf[7] = 'i';
  local_70._M_local_buf[8] = 's';
  local_70._M_local_buf[9] = 'e';
  local_78 = 10;
  local_70._M_local_buf[10] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0xc0);
  Analyser::Static::Enterprise::Target::Target(pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Enterprise::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'A';
  local_70._M_allocated_capacity._1_2_ = 0x7070;
  local_70._M_local_buf[3] = 'l';
  local_70._M_local_buf[4] = 'e';
  local_70._M_local_buf[5] = ' ';
  local_70._M_local_buf[6] = 'M';
  local_70._M_local_buf[7] = 'a';
  local_70._M_local_buf[8] = 'c';
  local_70._M_local_buf[9] = 'i';
  local_70._M_local_buf[10] = 'n';
  local_70._M_local_buf[0xb] = 't';
  local_70._M_local_buf[0xc] = 'o';
  local_70._M_local_buf[0xd] = 's';
  local_70._M_local_buf[0xe] = 'h';
  local_78 = 0xf;
  local_70._M_local_buf[0xf] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0x90);
  Analyser::Static::Macintosh::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Macintosh::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Macintosh::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'M';
  local_70._M_allocated_capacity._1_2_ = 0x5853;
  local_70._M_local_buf[3] = '\0';
  local_78 = 3;
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0xb8);
  Analyser::Static::MSX::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::MSX::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::MSX::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'O';
  local_70._M_allocated_capacity._1_2_ = 0x6972;
  local_70._M_local_buf[3] = 'c';
  local_78 = 4;
  local_70._M_local_buf[4] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0xc0);
  Analyser::Static::Oric::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Oric::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Oric::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'P';
  local_70._M_allocated_capacity._1_2_ = 0x2043;
  local_70._M_local_buf[3] = 'C';
  local_70._M_local_buf[4] = 'o';
  local_70._M_local_buf[5] = 'm';
  local_70._M_local_buf[6] = 'p';
  local_70._M_local_buf[7] = 'a';
  local_70._M_local_buf[8] = 't';
  local_70._M_local_buf[9] = 'i';
  local_70._M_local_buf[10] = 'b';
  local_70._M_local_buf[0xb] = 'l';
  local_70._M_local_buf[0xc] = 'e';
  local_78 = 0xd;
  local_70._M_local_buf[0xd] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0x90);
  Analyser::Static::PCCompatible::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::PCCompatible::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::PCCompatible::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'V';
  local_70._M_allocated_capacity._1_2_ = 0x6369;
  local_70._M_local_buf[3] = ' ';
  local_70._M_local_buf[4] = '2';
  local_70._M_local_buf[5] = '0';
  local_78 = 6;
  local_70._M_local_buf[6] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0xb8);
  Analyser::Static::Commodore::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Commodore::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Commodore::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'Z';
  local_70._M_allocated_capacity._1_2_ = 0x3858;
  local_70._M_local_buf[3] = '0';
  local_70._M_local_buf[4] = '/';
  local_70._M_local_buf[5] = '8';
  local_70._M_local_buf[6] = '1';
  local_78 = 7;
  local_70._M_local_buf[7] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0xb0);
  Analyser::Static::ZX8081::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::ZX8081::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::ZX8081::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  local_70._M_local_buf[0] = 'Z';
  local_70._M_allocated_capacity._1_2_ = 0x2058;
  local_70._M_local_buf[3] = 'S';
  local_70._M_local_buf[4] = 'p';
  local_70._M_local_buf[5] = 'e';
  local_70._M_local_buf[6] = 'c';
  local_70._M_local_buf[7] = 't';
  local_70._M_local_buf[8] = 'r';
  local_70._M_local_buf[9] = 'u';
  local_70._M_local_buf[10] = 'm';
  local_78 = 0xb;
  local_70._M_local_buf[0xb] = '\0';
  local_80 = &local_70;
  pTVar3 = (Target *)operator_new(0x90);
  Analyser::Static::ZXSpectrum::Target::Target((Target *)pTVar3);
  if (local_80 == &local_70) {
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.first._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
  local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
  local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
  local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
  local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
  local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
  local_60.first._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  local_60.second = pTVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::ZXSpectrum::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::ZXSpectrum::Target_*>
              *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                      CONCAT16(local_70._M_local_buf[6],
                                               CONCAT15(local_70._M_local_buf[5],
                                                        CONCAT14(local_70._M_local_buf[4],
                                                                 CONCAT13(local_70._M_local_buf[3],
                                                                          CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
  }
  if ((char)this == '\0') {
    local_70._M_local_buf[0] = 'A';
    local_70._M_allocated_capacity._1_2_ = 0x6174;
    local_70._M_local_buf[3] = 'r';
    local_70._M_local_buf[4] = 'i';
    local_70._M_local_buf[5] = ' ';
    local_70._M_local_buf[6] = '2';
    local_70._M_local_buf[7] = '6';
    local_70._M_local_buf[8] = '0';
    local_70._M_local_buf[9] = '0';
    local_78 = 10;
    local_70._M_local_buf[10] = '\0';
    local_80 = &local_70;
    local_60.second = (Target *)operator_new(0x88);
    ((local_60.second)->super_Target).state._M_t.
    super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>._M_t.
    super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
    super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl = (Struct *)0x0;
    ((local_60.second)->super_Target).machine = Atari2600;
    ((local_60.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_60.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_60.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_60.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_60.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_60.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_60.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_60.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_60.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_60.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_60.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_60.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&((local_60.second)->super_Target).confidence = 0;
    ((local_60.second)->super_Target)._vptr_Target = (_func_int **)&PTR__Target_0058d590;
    *(undefined1 *)
     &((local_60.second)->super_StructImpl<Analyser::Static::Enterprise::Target>).super_Struct.
      _vptr_Struct = 0;
    local_60.first.field_2._M_allocated_capacity =
         CONCAT17(local_70._M_local_buf[7],
                  CONCAT16(local_70._M_local_buf[6],
                           CONCAT15(local_70._M_local_buf[5],
                                    CONCAT14(local_70._M_local_buf[4],
                                             CONCAT13(local_70._M_local_buf[3],
                                                      CONCAT21(local_70._M_allocated_capacity._1_2_,
                                                               local_70._M_local_buf[0]))))));
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_string_length = 10;
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
    local_80 = &local_70;
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Atari2600::Target*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                *)__return_storage_ptr__,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Atari2600::Target_*>
                *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_60.first._M_dataplus._M_p,
                      local_60.first.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                        CONCAT16(local_70._M_local_buf[6],
                                                 CONCAT15(local_70._M_local_buf[5],
                                                          CONCAT14(local_70._M_local_buf[4],
                                                                   CONCAT13(local_70._M_local_buf[3]
                                                                            ,CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
    }
    local_70._M_local_buf[0] = 'C';
    local_70._M_allocated_capacity._1_2_ = 0x6c6f;
    local_70._M_local_buf[3] = 'e';
    local_70._M_local_buf[4] = 'c';
    local_70._M_local_buf[5] = 'o';
    local_70._M_local_buf[6] = 'V';
    local_70._M_local_buf[7] = 'i';
    local_70._M_local_buf[8] = 's';
    local_70._M_local_buf[9] = 'i';
    local_70._M_local_buf[10] = 'o';
    local_70._M_local_buf[0xb] = 'n';
    local_78 = 0xc;
    local_70._M_local_buf[0xc] = '\0';
    local_80 = &local_70;
    local_60.second = (Target *)operator_new(0x80);
    ((local_60.second)->super_Target)._vptr_Target = (_func_int **)&PTR__Target_0058d140;
    ((local_60.second)->super_Target).state._M_t.
    super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>._M_t.
    super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
    super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl = (Struct *)0x0;
    ((local_60.second)->super_Target).machine = ColecoVision;
    ((local_60.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_60.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_60.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_60.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_60.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_60.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_60.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_60.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_60.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_60.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_60.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_60.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_60.second)->super_Target).confidence = 0.0;
    local_60.first.field_2._M_allocated_capacity =
         CONCAT17(local_70._M_local_buf[7],
                  CONCAT16(local_70._M_local_buf[6],
                           CONCAT15(local_70._M_local_buf[5],
                                    CONCAT14(local_70._M_local_buf[4],
                                             CONCAT13(local_70._M_local_buf[3],
                                                      CONCAT21(local_70._M_allocated_capacity._1_2_,
                                                               local_70._M_local_buf[0]))))));
    local_60.first.field_2._8_8_ =
         CONCAT17(local_70._M_local_buf[0xf],
                  CONCAT16(local_70._M_local_buf[0xe],
                           CONCAT15(local_70._M_local_buf[0xd],
                                    CONCAT14(local_70._M_local_buf[0xc],
                                             CONCAT13(local_70._M_local_buf[0xb],
                                                      CONCAT12(local_70._M_local_buf[10],
                                                               CONCAT11(local_70._M_local_buf[9],
                                                                        local_70._M_local_buf[8]))))
                                   )));
    local_60.first._M_string_length = 0xc;
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
    local_80 = &local_70;
    local_60.first._M_dataplus._M_p = (pointer)paVar2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Target*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                *)__return_storage_ptr__,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Target_*>
                *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_60.first._M_dataplus._M_p,
                      local_60.first.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                        CONCAT16(local_70._M_local_buf[6],
                                                 CONCAT15(local_70._M_local_buf[5],
                                                          CONCAT14(local_70._M_local_buf[4],
                                                                   CONCAT13(local_70._M_local_buf[3]
                                                                            ,CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
    }
    local_38 = 0x12;
    local_80 = &local_70;
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_38);
    local_70._M_local_buf[0] = (char)local_38;
    local_70._M_allocated_capacity._1_2_ = (undefined2)(local_38 >> 8);
    local_70._M_local_buf[3] = (char)(local_38 >> 0x18);
    local_70._M_local_buf[4] = (char)(local_38 >> 0x20);
    local_70._M_local_buf[5] = (char)(local_38 >> 0x28);
    local_70._M_local_buf[6] = (char)(local_38 >> 0x30);
    local_70._M_local_buf[7] = (char)(local_38 >> 0x38);
    local_80->_M_allocated_capacity = 0x73614d2061676553;
    *(char *)((long)local_80->_M_local_buf + 8) = 't';
    *(char *)((long)local_80->_M_local_buf + 9) = 'e';
    *(char *)((long)local_80->_M_local_buf + 10) = 'r';
    *(char *)((long)local_80->_M_local_buf + 0xb) = ' ';
    *(char *)((long)local_80->_M_local_buf + 0xc) = 'S';
    *(char *)((long)local_80->_M_local_buf + 0xd) = 'y';
    *(char *)((long)local_80->_M_local_buf + 0xe) = 's';
    *(char *)((long)local_80->_M_local_buf + 0xf) = 't';
    *(char *)((long)local_80 + 0x10) = 'e';
    *(char *)((long)local_80 + 0x11) = 'm';
    local_78 = local_38;
    local_80->_M_local_buf[local_38] = '\0';
    pTVar3 = (Target *)operator_new(0x98);
    Analyser::Static::Sega::Target::Target((Target *)pTVar3);
    if (local_80 == &local_70) {
      local_60.first.field_2._8_8_ =
           CONCAT17(local_70._M_local_buf[0xf],
                    CONCAT16(local_70._M_local_buf[0xe],
                             CONCAT15(local_70._M_local_buf[0xd],
                                      CONCAT14(local_70._M_local_buf[0xc],
                                               CONCAT13(local_70._M_local_buf[0xb],
                                                        CONCAT12(local_70._M_local_buf[10],
                                                                 CONCAT11(local_70._M_local_buf[9],
                                                                          local_70._M_local_buf[8]))
                                                       )))));
      local_60.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_60.first._M_dataplus._M_p = (pointer)local_80;
    }
    local_60.first.field_2._M_allocated_capacity._1_2_ = local_70._M_allocated_capacity._1_2_;
    local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
    local_60.first.field_2._M_local_buf[3] = local_70._M_local_buf[3];
    local_60.first.field_2._M_local_buf[4] = local_70._M_local_buf[4];
    local_60.first.field_2._M_local_buf[5] = local_70._M_local_buf[5];
    local_60.first.field_2._M_local_buf[6] = local_70._M_local_buf[6];
    local_60.first.field_2._M_local_buf[7] = local_70._M_local_buf[7];
    local_60.first._M_string_length = local_78;
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
    local_80 = &local_70;
    local_60.second = pTVar3;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Sega::Target*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                *)__return_storage_ptr__,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Sega::Target_*>
                *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_60.first._M_dataplus._M_p,
                      local_60.first.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT17(local_70._M_local_buf[7],
                                        CONCAT16(local_70._M_local_buf[6],
                                                 CONCAT15(local_70._M_local_buf[5],
                                                          CONCAT14(local_70._M_local_buf[4],
                                                                   CONCAT13(local_70._M_local_buf[3]
                                                                            ,CONCAT21(local_70.
                                                  _M_allocated_capacity._1_2_,
                                                  local_70._M_local_buf[0])))))) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::unique_ptr<Analyser::Static::Target>> Machine::TargetsByMachineName(bool meaningful_without_media_only) {
	std::map<std::string, std::unique_ptr<Analyser::Static::Target>> options;

#define AddMapped(Name, TargetNamespace)	\
	options.emplace(std::make_pair(LongNameForTargetMachine(Analyser::Machine::Name), new Analyser::Static::TargetNamespace::Target));
#define Add(Name)	AddMapped(Name, Name)

	Add(Amiga);
	Add(AmstradCPC);
	Add(AppleII);
	Add(AppleIIgs);
	Add(AtariST);
	AddMapped(Electron, Acorn);
	Add(Enterprise);
	Add(Macintosh);
	Add(MSX);
	Add(Oric);
	Add(PCCompatible);
	AddMapped(Vic20, Commodore);
	Add(ZX8081);
	Add(ZXSpectrum);

	if(!meaningful_without_media_only) {
		Add(Atari2600);
		options.emplace(std::make_pair(LongNameForTargetMachine(Analyser::Machine::ColecoVision), new Analyser::Static::Target(Analyser::Machine::ColecoVision)));
		AddMapped(MasterSystem, Sega);
	}

#undef Add
#undef AddMapped

	return options;
}